

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGetProcAddressTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GetProcAddressExtensionCase::GetProcAddressExtensionCase
          (GetProcAddressExtensionCase *this,EglTestContext *eglTestCtx,char *name,char *description
          ,string *extName)

{
  pointer pcVar1;
  
  GetProcAddressCase::GetProcAddressCase
            (&this->super_GetProcAddressCase,eglTestCtx,name,description);
  (this->super_GetProcAddressCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GetProcAddressExtensionCase_0215a400;
  (this->m_extName)._M_dataplus._M_p = (pointer)&(this->m_extName).field_2;
  pcVar1 = (extName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_extName,pcVar1,pcVar1 + extName->_M_string_length);
  return;
}

Assistant:

GetProcAddressExtensionCase (EglTestContext& eglTestCtx, const char* name, const char* description, const std::string& extName)
		: GetProcAddressCase	(eglTestCtx, name, description)
		, m_extName				(extName)
	{
	}